

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix-qdf.cc
# Opt level: O1

void __thiscall QdfFixer::processLines(QdfFixer *this,string *input)

{
  pointer *ppbVar1;
  long lVar2;
  iterator __position;
  pointer pQVar3;
  pointer pcVar4;
  size_type sVar5;
  char cVar6;
  bool bVar7;
  anon_enum_32 aVar8;
  uint uVar9;
  int i;
  int iVar10;
  void *pvVar11;
  ulong uVar12;
  ostream *poVar13;
  size_type sVar14;
  long *plVar15;
  pointer psVar16;
  unsigned_long_long val;
  undefined8 *puVar17;
  ulong *puVar18;
  ulong uVar19;
  size_type *psVar20;
  size_t sVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  char cVar23;
  iterator iVar24;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *this_00;
  type ii;
  type ii_3;
  unsigned_long_long val_00;
  QPDFXRefEntry *e;
  pointer pQVar25;
  size_t sVar26;
  type ii_1;
  char *__s;
  string new_length;
  smatch m;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  string local_120;
  ulong local_100;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  uint local_cc;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_c8;
  size_t local_a0;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_98;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_90;
  char *local_88;
  ulong *local_80;
  uint local_78;
  undefined4 uStack_74;
  ulong local_70 [2];
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  string *local_40;
  vector<long_long,_std::allocator<long_long>_> *local_38;
  
  if ((processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_
                                  ), iVar10 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,"^(\\d+) 0 obj\n$",
               0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_
                                  ), iVar10 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_,
               "/Extends (\\d+ 0 R)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::
                                    re_ostream_obj_abi_cxx11_), iVar10 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,
               "^%% Object stream: object (\\d+)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_),
     iVar10 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_,"^\\d+\n$",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_)
     , iVar10 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_,"^  /Size \\d+\n$",
               0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_);
  }
  this->lineno = 0;
  local_138._M_len = 0;
  local_138._M_str = (char *)0x0;
  local_f8._M_current = (input->_M_dataplus)._M_p;
  local_a0 = input->_M_string_length;
  local_c8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_begin._M_current = (char *)0x0;
  local_c8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)&this->ostream;
  local_38 = &this->ostream_offsets;
  local_90 = (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)&this->ostream_discarded;
  local_40 = (string *)&this->ostream_extends;
  local_cc = (uint)CONCAT71((int7)((ulong)local_40 >> 8),1);
  local_100 = 0;
  __s = local_f8._M_current;
  do {
    paVar22 = &local_120.field_2;
    this->lineno = this->lineno + 1;
    lVar2 = this->offset;
    this->last_offset = lVar2;
    if (local_a0 == 0) {
      uVar12 = 0xffffffffffffffff;
    }
    else {
      pvVar11 = memchr(__s,10,local_a0);
      uVar12 = -(ulong)(pvVar11 == (void *)0x0) | (long)pvVar11 - (long)__s;
    }
    if (uVar12 == 0xffffffffffffffff) {
      local_138._M_len = local_a0;
      local_cc = 0;
      local_88 = __s;
    }
    else {
      uVar19 = uVar12 + 1;
      local_138._M_len = uVar19;
      if (local_a0 < uVar19) {
        local_138._M_len = local_a0;
      }
      local_a0 = local_a0 - uVar19;
      local_88 = __s + uVar12 + 1;
    }
    sVar26 = local_138._M_len;
    local_f8._M_current = local_f8._M_current + local_100;
    local_100 = local_138._M_len;
    this->offset = local_138._M_len + lVar2;
    local_138._M_str = __s;
    switch(this->state) {
    case st_top:
      bVar7 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + local_138._M_len),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,0);
      sVar26 = local_138._M_len;
      if (bVar7) {
        if (local_c8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_c8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar7 = false;
        }
        else {
          bVar7 = ((long)local_c8.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c8.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 5U
                  < 0xfffffffffffffffe;
        }
        psVar16 = local_c8.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
        if (bVar7) {
          psVar16 = local_c8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        if (psVar16->matched == true) {
          local_120._M_dataplus._M_p = (pointer)paVar22;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_120,
                     (psVar16->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar16->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_120._M_string_length = 0;
          local_120.field_2._M_allocated_capacity =
               local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_120._M_dataplus._M_p = (pointer)paVar22;
        }
        checkObjId(this,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar22) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        aVar8 = st_in_obj;
      }
      else {
        if (local_138._M_len == 0) {
          bVar7 = true;
        }
        else {
          sVar21 = 5;
          if (local_138._M_len < 5) {
            sVar21 = local_138._M_len;
          }
          iVar10 = bcmp(local_138._M_str,"xref\n",sVar21);
          bVar7 = iVar10 == 0;
        }
        if ((bool)(bVar7 ^ 1U | sVar26 != 5)) goto LAB_001137bc;
        this->xref_offset = this->last_offset;
        aVar8 = st_at_xref;
      }
      this->state = aVar8;
      goto LAB_001137bc;
    case st_in_obj:
      std::__ostream_insert<char,std::char_traits<char>>(this->out,__s,local_138._M_len);
      sVar26 = local_138._M_len;
      sVar21 = 7;
      if (local_138._M_len < 7) {
        sVar21 = local_138._M_len;
      }
      if (local_138._M_len == 0) {
        bVar7 = true;
      }
      else {
        iVar10 = bcmp(local_138._M_str,"stream\n",sVar21);
        bVar7 = iVar10 == 0;
      }
      if ((bool)(bVar7 ^ 1U | sVar26 != 7)) {
        if (sVar26 == 0) {
          bVar7 = true;
        }
        else {
          iVar10 = bcmp(local_138._M_str,"endobj\n",sVar21);
          bVar7 = iVar10 == 0;
        }
        if ((bool)(bVar7 ^ 1U | sVar26 != 7)) {
          sVar14 = std::basic_string_view<char,_std::char_traits<char>_>::find
                             (&local_138,"/Type /ObjStm",0,0xd);
          if (sVar14 == 0xffffffffffffffff) {
            sVar14 = std::basic_string_view<char,_std::char_traits<char>_>::find
                               (&local_138,"/Type /XRef",0,0xb);
            if (sVar14 != 0xffffffffffffffff) {
              uVar12 = QPDFXRefEntry::getOffset();
              this->xref_offset = uVar12;
              sVar26 = 0;
              if (uVar12 != 0) {
                do {
                  sVar26 = sVar26 + 1;
                  bVar7 = 0xff < uVar12;
                  uVar12 = (long)uVar12 >> 8;
                } while (bVar7);
              }
              this->xref_f1_nbytes = sVar26;
              pQVar3 = (this->xref).
                       super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              uVar9 = 1;
              for (pQVar25 = (this->xref).
                             super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
                             _M_impl.super__Vector_impl_data._M_start; pQVar25 != pQVar3;
                  pQVar25 = pQVar25 + 0x18) {
                iVar10 = QPDFXRefEntry::getType();
                if ((iVar10 == 2) &&
                   (iVar10 = QPDFXRefEntry::getObjStreamIndex(), (int)uVar9 < iVar10)) {
                  uVar9 = QPDFXRefEntry::getObjStreamIndex();
                }
              }
              if (uVar9 != 0) {
                sVar26 = this->xref_f2_nbytes;
                do {
                  sVar26 = sVar26 + 1;
                  bVar7 = 0xff < uVar9;
                  uVar9 = (int)uVar9 >> 8;
                } while (bVar7);
                this->xref_f2_nbytes = sVar26;
              }
              poVar13 = this->out;
              this->xref_size =
                   ((long)(this->xref).
                          super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->xref).
                          super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 1;
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  /Length ",10);
              poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  /W [ 1 ",9);
              poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," ]\n",3);
              this->state = st_in_xref_stream_dict;
            }
          }
          else {
            this->state = st_in_ostream_dict;
            this->ostream_id = this->last_obj;
          }
        }
        else {
          this->state = st_top;
        }
      }
      else {
        this->state = st_in_stream;
        this->stream_start = this->offset;
      }
      break;
    case st_in_stream:
      if (local_138._M_len == 0) {
        bVar7 = true;
      }
      else {
        sVar21 = 10;
        if (local_138._M_len < 10) {
          sVar21 = local_138._M_len;
        }
        iVar10 = bcmp(__s,"endstream\n",sVar21);
        bVar7 = iVar10 == 0;
      }
      if ((bool)(sVar26 == 10 & bVar7)) {
        sVar26 = lVar2 - this->stream_start;
        if ((long)sVar26 < 0) {
          QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar26);
        }
        this->stream_length = sVar26;
        this->state = st_after_stream;
      }
      goto LAB_001137bc;
    case st_after_stream:
      if (local_138._M_len == 0) {
        bVar7 = true;
      }
      else {
        sVar21 = 0x15;
        if (local_138._M_len < 0x15) {
          sVar21 = local_138._M_len;
        }
        iVar10 = bcmp(__s,"%QDF: ignore_newline\n",sVar21);
        bVar7 = iVar10 == 0;
      }
      if ((bool)(sVar26 == 0x15 & bVar7)) {
        if (this->stream_length != 0) {
          this->stream_length = this->stream_length - 1;
        }
      }
      else {
        bVar7 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_f8._M_current + sVar26),&local_c8,
                           &processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,0);
        if (bVar7) {
          if (local_c8.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_c8.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            bVar7 = false;
          }
          else {
            bVar7 = ((long)local_c8.
                           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_c8.
                           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
                    5U < 0xfffffffffffffffe;
          }
          psVar16 = local_c8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -3;
          if (bVar7) {
            psVar16 = local_c8.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          if (psVar16->matched == true) {
            local_120._M_dataplus._M_p = (pointer)paVar22;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_120,
                       (psVar16->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (psVar16->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_120._M_string_length = 0;
            local_120.field_2._M_allocated_capacity =
                 local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_120._M_dataplus._M_p = (pointer)paVar22;
          }
          checkObjId(this,&local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != paVar22) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          this->state = st_in_length;
        }
      }
LAB_001137bc:
      std::__ostream_insert<char,std::char_traits<char>>
                (this->out,local_138._M_str,local_138._M_len);
      break;
    case st_in_ostream_dict:
      if (local_138._M_len == 0) {
        bVar7 = true;
      }
      else {
        sVar21 = 7;
        if (local_138._M_len < 7) {
          sVar21 = local_138._M_len;
        }
        iVar10 = bcmp(__s,"stream\n",sVar21);
        bVar7 = iVar10 == 0;
      }
      if ((bool)(sVar26 == 7 & bVar7)) {
        this->state = st_in_ostream_offsets;
      }
      else {
        iVar24._M_current =
             (this->ostream_discarded).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar24._M_current ==
            (this->ostream_discarded).
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                    (local_90,iVar24,&local_138);
        }
        else {
          (iVar24._M_current)->_M_len = local_138._M_len;
          (iVar24._M_current)->_M_str = local_138._M_str;
          ppbVar1 = &(this->ostream_discarded).
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppbVar1 = *ppbVar1 + 1;
        }
        bVar7 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_f8._M_current + local_100),&local_c8,
                           &processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_,0);
        if (bVar7) {
          if (local_c8.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_c8.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            bVar7 = false;
          }
          else {
            bVar7 = ((long)local_c8.
                           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_c8.
                           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
                    5U < 0xfffffffffffffffe;
          }
          psVar16 = local_c8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -3;
          if (bVar7) {
            psVar16 = local_c8.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          if (psVar16->matched == true) {
            local_120._M_dataplus._M_p = (pointer)paVar22;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_120,
                       (psVar16->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (psVar16->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_120._M_string_length = 0;
            local_120.field_2._M_allocated_capacity =
                 local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_120._M_dataplus._M_p = (pointer)paVar22;
          }
          std::__cxx11::string::operator=(local_40,(string *)&local_120);
          goto LAB_001138bd;
        }
      }
      break;
    case st_in_ostream_offsets:
      bVar7 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + local_138._M_len),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,0);
      if (bVar7) {
        if (local_c8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_c8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar7 = false;
        }
        else {
          bVar7 = ((long)local_c8.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c8.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 5U
                  < 0xfffffffffffffffe;
        }
        psVar16 = local_c8.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
        if (bVar7) {
          psVar16 = local_c8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        if (psVar16->matched == true) {
          local_120._M_dataplus._M_p = (pointer)paVar22;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_120,
                     (psVar16->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar16->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_120._M_string_length = 0;
          local_120.field_2._M_allocated_capacity =
               local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_120._M_dataplus._M_p = (pointer)paVar22;
        }
        checkObjId(this,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar22) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        iVar24._M_current =
             (this->ostream).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        this->stream_start = this->last_offset;
        this->state = st_in_ostream_outer;
        goto LAB_0011357f;
      }
      iVar24._M_current =
           (this->ostream_discarded).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = local_90;
      if (iVar24._M_current !=
          (this->ostream_discarded).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        (iVar24._M_current)->_M_len = local_138._M_len;
        (iVar24._M_current)->_M_str = local_138._M_str;
        ppbVar1 = &(this->ostream_discarded).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
        break;
      }
LAB_001135ae:
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                (this_00,iVar24,&local_138);
      break;
    case st_in_ostream_outer:
      adjustOstreamXref(this);
      local_120._M_dataplus._M_p = (pointer)(this->last_offset - this->stream_start);
      __position._M_current =
           (this->ostream_offsets).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->ostream_offsets).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (local_38,__position,(longlong *)&local_120);
      }
      else {
        *__position._M_current = (longlong)local_120._M_dataplus._M_p;
        (this->ostream_offsets).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      this->state = st_in_ostream_obj;
      iVar24._M_current =
           (this->ostream).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_0011357f:
      this_00 = local_98;
      if (iVar24._M_current ==
          (this->ostream).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001135ae;
      (iVar24._M_current)->_M_len = local_138._M_len;
      (iVar24._M_current)->_M_str = local_138._M_str;
      ppbVar1 = &(this->ostream).
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppbVar1 = *ppbVar1 + 1;
      break;
    case st_in_ostream_obj:
      iVar24._M_current =
           (this->ostream).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar24._M_current ==
          (this->ostream).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  (local_98,iVar24,&local_138);
      }
      else {
        (iVar24._M_current)->_M_len = local_138._M_len;
        (iVar24._M_current)->_M_str = __s;
        ppbVar1 = &(this->ostream).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      bVar7 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + local_100),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,0);
      sVar26 = local_138._M_len;
      if (bVar7) {
        if (local_c8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_c8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar7 = false;
        }
        else {
          bVar7 = ((long)local_c8.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c8.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 5U
                  < 0xfffffffffffffffe;
        }
        psVar16 = local_c8.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
        if (bVar7) {
          psVar16 = local_c8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        if (psVar16->matched == true) {
          local_120._M_dataplus._M_p = (pointer)paVar22;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_120,
                     (psVar16->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar16->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_120._M_string_length = 0;
          local_120.field_2._M_allocated_capacity =
               local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_120._M_dataplus._M_p = (pointer)paVar22;
        }
        checkObjId(this,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar22) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        this->state = st_in_ostream_outer;
      }
      else {
        if (local_138._M_len == 0) {
          bVar7 = true;
        }
        else {
          sVar21 = 10;
          if (local_138._M_len < 10) {
            sVar21 = local_138._M_len;
          }
          iVar10 = bcmp(local_138._M_str,"endstream\n",sVar21);
          bVar7 = iVar10 == 0;
        }
        if (!(bool)(bVar7 ^ 1U | sVar26 != 10)) {
          sVar26 = this->last_offset - this->stream_start;
          if ((long)sVar26 < 0) {
            QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar26);
          }
          this->stream_length = sVar26;
          writeOstream(this);
          this->state = st_in_obj;
        }
      }
      break;
    case st_in_xref_stream_dict:
      sVar14 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_138,"/Length",0,7)
      ;
      if ((sVar14 == 0xffffffffffffffff) &&
         (sVar14 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_138,"/W",0,2),
         sVar14 == 0xffffffffffffffff)) {
        sVar14 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_138,"/Size",0,5)
        ;
        if (sVar14 == 0xffffffffffffffff) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->out,local_138._M_str,local_138._M_len);
        }
        else {
          poVar13 = this->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  /Size ",8);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
        }
      }
      sVar26 = local_138._M_len;
      if (local_138._M_len == 0) {
        bVar7 = true;
      }
      else {
        sVar21 = 7;
        if (local_138._M_len < 7) {
          sVar21 = local_138._M_len;
        }
        iVar10 = bcmp(local_138._M_str,"stream\n",sVar21);
        bVar7 = iVar10 == 0;
      }
      if (!(bool)(bVar7 ^ 1U | sVar26 != 7)) {
        writeBinary(this,0,1);
        writeBinary(this,0,this->xref_f1_nbytes);
        writeBinary(this,0,this->xref_f2_nbytes);
        pQVar3 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pQVar25 = (this->xref).
                       super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
                       super__Vector_impl_data._M_start; pQVar25 != pQVar3; pQVar25 = pQVar25 + 0x18
            ) {
          uVar9 = QPDFXRefEntry::getType();
          if ((int)uVar9 < 0) {
            QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(uVar9);
          }
          if (uVar9 == 1) {
            val = QPDFXRefEntry::getOffset();
            if ((long)val < 0) {
              QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::error(val);
            }
            val_00 = 0;
          }
          else {
            iVar10 = QPDFXRefEntry::getObjStreamNumber();
            if (iVar10 < 0) {
              QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(iVar10);
            }
            i = QPDFXRefEntry::getObjStreamIndex();
            if (i < 0) {
              QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(i);
            }
            val = (unsigned_long_long)iVar10;
            val_00 = (unsigned_long_long)i;
          }
          writeBinary(this,(ulong)uVar9,1);
          writeBinary(this,val,this->xref_f1_nbytes);
          writeBinary(this,val_00,this->xref_f2_nbytes);
        }
        poVar13 = this->out;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\nendstream\nendobj\n\n",0x13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"startxref\n",10);
        poVar13 = std::ostream::_M_insert<long_long>((longlong)poVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n%%EOF\n",7);
LAB_00113b76:
        this->state = st_done;
      }
      break;
    case st_in_length:
      bVar7 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + local_138._M_len),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_,0);
      if (!bVar7) {
        pcVar4 = (this->filename)._M_dataplus._M_p;
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar4,pcVar4 + (this->filename)._M_string_length);
        std::__cxx11::string::append((char *)&local_60);
        uVar12 = this->lineno;
        cVar23 = '\x01';
        if (uVar12 < 10) goto LAB_00113e17;
        uVar19 = uVar12;
        cVar6 = '\x04';
        goto LAB_00113c0e;
      }
      uVar12 = this->stream_length;
      cVar23 = '\x01';
      if (9 < uVar12) {
        uVar19 = uVar12;
        cVar6 = '\x04';
        do {
          cVar23 = cVar6;
          if (uVar19 < 100) {
            cVar23 = cVar23 + -2;
            goto LAB_00113671;
          }
          if (uVar19 < 1000) {
            cVar23 = cVar23 + -1;
            goto LAB_00113671;
          }
          if (uVar19 < 10000) goto LAB_00113671;
          bVar7 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar6 = cVar23 + '\x04';
        } while (bVar7);
        cVar23 = cVar23 + '\x01';
      }
LAB_00113671:
      local_f0 = &local_e0;
      std::__cxx11::string::_M_construct((ulong)&local_f0,cVar23);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f0,(uint)local_e8,uVar12);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_f0);
      puVar18 = (ulong *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_120.field_2._M_allocated_capacity = *puVar18;
        local_120.field_2._8_8_ = plVar15[3];
        local_120._M_dataplus._M_p = (pointer)paVar22;
      }
      else {
        local_120.field_2._M_allocated_capacity = *puVar18;
        local_120._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_120._M_string_length = plVar15[1];
      *plVar15 = (long)puVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      sVar26 = local_138._M_len;
      if ((long)local_138._M_len < 0) {
        QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(local_138._M_len);
      }
      sVar5 = local_120._M_string_length;
      this->offset = this->offset - sVar26;
      if ((long)local_120._M_string_length < 0) {
        QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error
                  (local_120._M_string_length);
      }
      this->offset = this->offset + sVar5;
      std::__ostream_insert<char,std::char_traits<char>>
                (this->out,local_120._M_dataplus._M_p,local_120._M_string_length);
      this->state = st_top;
LAB_001138bd:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar22) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      break;
    case st_at_xref:
      poVar13 = this->out;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"0 ",2);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n0000000000 65535 f \n",0x15);
      pQVar3 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pQVar25 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
                     _M_impl.super__Vector_impl_data._M_start; pQVar25 != pQVar3;
          pQVar25 = pQVar25 + 0x18) {
        poVar13 = this->out;
        iVar10 = QPDFXRefEntry::getOffset();
        QUtil::int_to_string_abi_cxx11_((longlong)&local_120,iVar10);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_120._M_dataplus._M_p,local_120._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," 00000 n \n",10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar22) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
      }
      this->state = st_before_trailer;
      break;
    case st_before_trailer:
      if (local_138._M_len == 0) {
        bVar7 = true;
      }
      else {
        sVar21 = 0xb;
        if (local_138._M_len < 0xb) {
          sVar21 = local_138._M_len;
        }
        iVar10 = bcmp(__s,"trailer <<\n",sVar21);
        bVar7 = iVar10 == 0;
      }
      if ((bool)(sVar26 == 0xb & bVar7)) {
        std::__ostream_insert<char,std::char_traits<char>>(this->out,local_138._M_str,local_100);
        this->state = st_in_trailer;
      }
      break;
    case st_in_trailer:
      bVar7 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + local_138._M_len),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_,0);
      if (bVar7) {
        poVar13 = this->out;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  /Size ",8);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->out,local_138._M_str,local_138._M_len);
      }
      sVar26 = local_138._M_len;
      if (local_138._M_len == 0) {
        bVar7 = true;
      }
      else {
        sVar21 = 3;
        if (local_138._M_len < 3) {
          sVar21 = local_138._M_len;
        }
        iVar10 = bcmp(local_138._M_str,">>\n",sVar21);
        bVar7 = iVar10 == 0;
      }
      if (!(bool)(bVar7 ^ 1U | sVar26 != 3)) {
        poVar13 = this->out;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"startxref\n",10);
        poVar13 = std::ostream::_M_insert<long_long>((longlong)poVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n%%EOF\n",7);
        goto LAB_00113b76;
      }
    }
    __s = local_88;
    if ((local_cc & 1) == 0) {
      if (local_c8.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
  while( true ) {
    if (uVar19 < 10000) goto LAB_00113e17;
    bVar7 = uVar19 < 100000;
    uVar19 = uVar19 / 10000;
    cVar6 = cVar23 + '\x04';
    if (bVar7) break;
LAB_00113c0e:
    cVar23 = cVar6;
    if (uVar19 < 100) {
      cVar23 = cVar23 + -2;
      goto LAB_00113e17;
    }
    if (uVar19 < 1000) {
      cVar23 = cVar23 + -1;
      goto LAB_00113e17;
    }
  }
  cVar23 = cVar23 + '\x01';
LAB_00113e17:
  local_80 = local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,cVar23);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_80,local_78,uVar12);
  uVar12 = CONCAT44(uStack_74,local_78) + local_58;
  uVar19 = 0xf;
  if (local_60 != local_50) {
    uVar19 = local_50[0];
  }
  if (uVar19 < uVar12) {
    uVar19 = 0xf;
    if (local_80 != local_70) {
      uVar19 = local_70[0];
    }
    if (uVar12 <= uVar19) {
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_60);
      goto LAB_00113ec2;
    }
  }
  puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80);
LAB_00113ec2:
  local_f0 = (long *)*puVar17;
  plVar15 = puVar17 + 2;
  if (local_f0 == plVar15) {
    local_e0 = *plVar15;
    uStack_d8 = puVar17[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar15;
  }
  local_e8 = puVar17[1];
  *puVar17 = plVar15;
  puVar17[1] = 0;
  *(undefined1 *)plVar15 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_120._M_dataplus._M_p = (pointer)*plVar15;
  psVar20 = (size_type *)(plVar15 + 2);
  if ((size_type *)local_120._M_dataplus._M_p == psVar20) {
    local_120.field_2._M_allocated_capacity = *psVar20;
    local_120.field_2._8_8_ = plVar15[3];
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar20;
  }
  local_120._M_string_length = plVar15[1];
  *plVar15 = (long)psVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,local_120._M_dataplus._M_p,local_120._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar13);
  exit(2);
}

Assistant:

void
QdfFixer::processLines(std::string const& input)
{
    using namespace std::literals;

    static const std::regex re_n_0_obj("^(\\d+) 0 obj\n$");
    static const std::regex re_extends("/Extends (\\d+ 0 R)");
    static const std::regex re_ostream_obj("^%% Object stream: object (\\d+)");
    static const std::regex re_num("^\\d+\n$");
    static const std::regex re_size_n("^  /Size \\d+\n$");

    auto sv_diff = [](size_t i) { return static_cast<std::string_view::difference_type>(i); };

    lineno = 0;
    bool more = true;
    auto len_line = sv_diff(0);

    std::string_view line;
    std::string_view input_view{input.data(), input.size()};
    size_t offs = 0;

    auto b_line = input.cbegin();
    std::smatch m;
    auto const matches = [&m, &b_line, &len_line](std::regex const& r) {
        return std::regex_search(b_line, b_line + len_line, m, r);
    };

    while (more) {
        ++lineno;
        last_offset = offset;
        b_line += len_line;

        offs = input_view.find('\n');
        if (offs == std::string::npos) {
            more = false;
            line = input_view;
        } else {
            offs++;
            line = input_view.substr(0, offs);
            input_view.remove_prefix(offs);
        }
        len_line = sv_diff(line.size());
        offset += len_line;

        if (state == st_top) {
            if (matches(re_n_0_obj)) {
                checkObjId(m[1].str());
                state = st_in_obj;
            } else if (line.compare("xref\n"sv) == 0) {
                xref_offset = last_offset;
                state = st_at_xref;
            }
            out << line;
        } else if (state == st_in_obj) {
            out << line;
            if (line.compare("stream\n"sv) == 0) {
                state = st_in_stream;
                stream_start = offset;
            } else if (line.compare("endobj\n"sv) == 0) {
                state = st_top;
            } else if (line.find("/Type /ObjStm"sv) != line.npos) {
                state = st_in_ostream_dict;
                ostream_id = last_obj;
            } else if (line.find("/Type /XRef"sv) != line.npos) {
                xref_offset = xref.back().getOffset();
                xref_f1_nbytes = 0;
                auto t = xref_offset;
                while (t) {
                    t >>= 8;
                    ++xref_f1_nbytes;
                }
                // Figure out how many bytes we need for ostream
                // index. Make sure we get at least 1 byte even if
                // there are no object streams.
                int max_objects = 1;
                for (auto const& e: xref) {
                    if ((e.getType() == 2) && (e.getObjStreamIndex() > max_objects)) {
                        max_objects = e.getObjStreamIndex();
                    }
                }
                while (max_objects) {
                    max_objects >>= 8;
                    ++xref_f2_nbytes;
                }
                auto esize = 1 + xref_f1_nbytes + xref_f2_nbytes;
                xref_size = 1 + xref.size();
                auto length = xref_size * esize;
                out << "  /Length " << length << "\n"
                    << "  /W [ 1 " << xref_f1_nbytes << " " << xref_f2_nbytes << " ]\n";
                state = st_in_xref_stream_dict;
            }
        } else if (state == st_in_ostream_dict) {
            if (line.compare("stream\n"sv) == 0) {
                state = st_in_ostream_offsets;
            } else {
                ostream_discarded.push_back(line);
                if (matches(re_extends)) {
                    ostream_extends = m[1].str();
                }
            }
            // discard line
        } else if (state == st_in_ostream_offsets) {
            if (matches(re_ostream_obj)) {
                checkObjId(m[1].str());
                stream_start = last_offset;
                state = st_in_ostream_outer;
                ostream.push_back(line);
            } else {
                ostream_discarded.push_back(line);
            }
            // discard line
        } else if (state == st_in_ostream_outer) {
            adjustOstreamXref();
            ostream_offsets.push_back(last_offset - stream_start);
            state = st_in_ostream_obj;
            ostream.push_back(line);
        } else if (state == st_in_ostream_obj) {
            ostream.push_back(line);
            if (matches(re_ostream_obj)) {
                checkObjId(m[1].str());
                state = st_in_ostream_outer;
            } else if (line.compare("endstream\n"sv) == 0) {
                stream_length = QIntC::to_size(last_offset - stream_start);
                writeOstream();
                state = st_in_obj;
            }
        } else if (state == st_in_xref_stream_dict) {
            if ((line.find("/Length"sv) != line.npos) || (line.find("/W"sv) != line.npos)) {
                // already printed
            } else if (line.find("/Size"sv) != line.npos) {
                auto size = 1 + xref.size();
                out << "  /Size " << size << "\n";
            } else {
                out << line;
            }
            if (line.compare("stream\n"sv) == 0) {
                writeBinary(0, 1);
                writeBinary(0, xref_f1_nbytes);
                writeBinary(0, xref_f2_nbytes);
                for (auto const& x: xref) {
                    unsigned long long f1 = 0;
                    unsigned long long f2 = 0;
                    unsigned int type = QIntC::to_uint(x.getType());
                    if (1 == type) {
                        f1 = QIntC::to_ulonglong(x.getOffset());
                    } else {
                        f1 = QIntC::to_ulonglong(x.getObjStreamNumber());
                        f2 = QIntC::to_ulonglong(x.getObjStreamIndex());
                    }
                    writeBinary(type, 1);
                    writeBinary(f1, xref_f1_nbytes);
                    writeBinary(f2, xref_f2_nbytes);
                }
                out << "\nendstream\nendobj\n\n"
                    << "startxref\n"
                    << xref_offset << "\n%%EOF\n";
                state = st_done;
            }
        } else if (state == st_in_stream) {
            if (line.compare("endstream\n"sv) == 0) {
                stream_length = QIntC::to_size(last_offset - stream_start);
                state = st_after_stream;
            }
            out << line;
        } else if (state == st_after_stream) {
            if (line.compare("%QDF: ignore_newline\n"sv) == 0) {
                if (stream_length > 0) {
                    --stream_length;
                }
            } else if (matches(re_n_0_obj)) {
                checkObjId(m[1].str());
                state = st_in_length;
            }
            out << line;
        } else if (state == st_in_length) {
            if (!matches(re_num)) {
                fatal(filename + ":" + std::to_string(lineno) + ": expected integer");
            }
            std::string new_length = std::to_string(stream_length) + "\n";
            offset -= QIntC::to_offset(line.length());
            offset += QIntC::to_offset(new_length.length());
            out << new_length;
            state = st_top;
        } else if (state == st_at_xref) {
            auto n = xref.size();
            out << "0 " << 1 + n << "\n0000000000 65535 f \n";
            for (auto const& e: xref) {
                out << QUtil::int_to_string(e.getOffset(), 10) << " 00000 n \n";
            }
            state = st_before_trailer;
        } else if (state == st_before_trailer) {
            if (line.compare("trailer <<\n"sv) == 0) {
                out << line;
                state = st_in_trailer;
            }
            // no output
        } else if (state == st_in_trailer) {
            if (matches(re_size_n)) {
                out << "  /Size " << 1 + xref.size() << "\n";
            } else {
                out << line;
            }
            if (line.compare(">>\n"sv) == 0) {
                out << "startxref\n" << xref_offset << "\n%%EOF\n";
                state = st_done;
            }
        } else if (state == st_done) {
            // ignore
        }
    }
}